

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O3

type_conflict1 __thiscall
llama_model_loader::get_arr_n<unsigned_int>
          (llama_model_loader *this,string *key,uint *result,bool required)

{
  int k;
  runtime_error *this_00;
  ArrayInfo arr_info;
  string sStack_48;
  
  k = gguf_find_key((this->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t
                    .super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                    super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                    (key->_M_dataplus)._M_p);
  if (k < 0) {
    if (required) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&sStack_48,"key not found in model: %s",(key->_M_dataplus)._M_p);
      std::runtime_error::runtime_error(this_00,(string *)&sStack_48);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv
              ((ArrayInfo *)&sStack_48,
               (this->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
               super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
               super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,k);
    *result = (uint)sStack_48._M_string_length;
  }
  return -1 < k;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, bool>::type
    llama_model_loader::get_arr_n(const std::string & key, T & result, bool required) {
        const int kid = gguf_find_key(meta.get(), key.c_str());

        if (kid < 0) {
            if (required) {
                throw std::runtime_error(format("key not found in model: %s", key.c_str()));
            }
            return false;
        }

        struct GGUFMeta::ArrayInfo arr_info =
            GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv(meta.get(), kid);


        result = arr_info.length;
        return true;
    }